

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimemagicrule.cpp
# Opt level: O2

Type QMimeMagicRule::type(QByteArray *theTypeName)

{
  bool bVar1;
  int i;
  long index;
  long in_FS_OFFSET;
  View local_50;
  QByteArrayView local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  for (index = 1; index != 9; index = index + 1) {
    local_40.m_data = (theTypeName->d).ptr;
    local_40.m_size = (theTypeName->d).size;
    local_50 = QOffsetStringArray<std::array<char,_65UL>,_std::array<unsigned_char,_10UL>_>::viewAt
                         (&magicRuleTypes,index);
    bVar1 = ::comparesEqual(&local_40,&local_50);
    if (bVar1) goto LAB_00446681;
  }
  index = 0;
LAB_00446681:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (Type)index;
  }
  __stack_chk_fail();
}

Assistant:

QMimeMagicRule::Type QMimeMagicRule::type(const QByteArray &theTypeName)
{
    for (int i = String; i <= Byte; ++i) {
        if (theTypeName == magicRuleTypes.viewAt(i))
            return Type(i);
    }
    return Invalid;
}